

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UObject * __thiscall
icu_63::SimpleFactory::create
          (SimpleFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnicodeString temp;
  UnicodeString local_58;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
    local_58.fUnion.fStackFields.fLengthAndFlags = 2;
    iVar2 = (*(key->super_UObject)._vptr_UObject[5])(key,&local_58);
    UVar1 = UnicodeString::operator==(&this->_id,(UnicodeString *)CONCAT44(extraout_var,iVar2));
    if (UVar1 != '\0') {
      iVar2 = (*(service->super_ICUNotifier)._vptr_ICUNotifier[0xe])(service,this->_instance);
      service = (ICUService *)CONCAT44(extraout_var_00,iVar2);
    }
    UnicodeString::~UnicodeString(&local_58);
    if (UVar1 != '\0') {
      return (UObject *)service;
    }
  }
  return (UObject *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result) const 
{
    return getDisplayName(id, result, Locale::getDefault());
}